

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

void clipp::detail::anon_unknown_6::execute_actions(parsing_result *res)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  parameter *ppVar4;
  int __c;
  int __c_00;
  int __c_01;
  arg_mapping **__s;
  parsing_result *in_RDI;
  missing_event m_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  missing_events *__range2_1;
  parameter *param;
  arg_mapping *m;
  iterator __end2;
  iterator __begin2;
  parsing_result *__range2;
  parsing_result *in_stack_ffffffffffffff78;
  arg_mapping *in_stack_ffffffffffffff80;
  action_provider<clipp::parameter> *in_stack_ffffffffffffff98;
  action_provider<clipp::parameter> *in_stack_ffffffffffffffa0;
  parameter *in_stack_ffffffffffffffa8;
  action_provider<clipp::parameter> *in_stack_ffffffffffffffb0;
  __normal_iterator<const_clipp::parser::missing_event_*,_std::vector<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>_>
  local_40;
  missing_events *local_38;
  parameter *local_30;
  reference local_28;
  arg_mapping *local_20;
  __normal_iterator<const_clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
  local_18 [2];
  parsing_result *local_8;
  
  local_8 = in_RDI;
  local_18[0]._M_current = (arg_mapping *)parsing_result::begin(in_stack_ffffffffffffff78);
  local_20 = (arg_mapping *)parsing_result::end(in_stack_ffffffffffffff78);
  while( true ) {
    __s = &local_20;
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<const_clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    local_28 = __gnu_cxx::
               __normal_iterator<const_clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
               ::operator*(local_18);
    ppVar4 = parser::arg_mapping::param(in_stack_ffffffffffffff80);
    if (ppVar4 != (parameter *)0x0) {
      local_30 = parser::arg_mapping::param(in_stack_ffffffffffffff80);
      sVar2 = parser::arg_mapping::repeat(local_28);
      if (sVar2 != 0) {
        in_stack_ffffffffffffffa0 = &local_30->super_action_provider<clipp::parameter>;
        pcVar3 = parser::arg_mapping::index(local_28,(char *)__s,__c);
        __s = (arg_mapping **)((ulong)pcVar3 & 0xffffffff);
        action_provider<clipp::parameter>::notify_repeated
                  (in_stack_ffffffffffffffa0,(arg_index)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      }
      bVar1 = parser::arg_mapping::blocked(local_28);
      if (bVar1) {
        in_stack_ffffffffffffff98 = &local_30->super_action_provider<clipp::parameter>;
        pcVar3 = parser::arg_mapping::index(local_28,(char *)__s,__c_00);
        __s = (arg_mapping **)((ulong)pcVar3 & 0xffffffff);
        action_provider<clipp::parameter>::notify_blocked
                  (in_stack_ffffffffffffffa0,(arg_index)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      }
      bVar1 = parser::arg_mapping::conflict(local_28);
      if (bVar1) {
        parser::arg_mapping::index(local_28,(char *)__s,__c_01);
        action_provider<clipp::parameter>::notify_conflict
                  (in_stack_ffffffffffffffa0,(arg_index)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      }
      bVar1 = parser::arg_mapping::any_error(in_stack_ffffffffffffff80);
      if (!bVar1) {
        parser::arg_mapping::arg_abi_cxx11_(local_28);
        action_provider<clipp::parameter>::execute_actions
                  (in_stack_ffffffffffffffb0,(arg_string *)in_stack_ffffffffffffffa8);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
    ::operator++(local_18);
  }
  local_38 = parsing_result::missing(local_8);
  local_40._M_current =
       (missing_event *)
       std::vector<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>::
       begin((vector<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_> *)
             in_stack_ffffffffffffff78);
  std::vector<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>::end
            ((vector<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_> *)
             in_stack_ffffffffffffff78);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_clipp::parser::missing_event_*,_std::vector<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>_>
                             *)in_stack_ffffffffffffff80,
                            (__normal_iterator<const_clipp::parser::missing_event_*,_std::vector<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>_>
                             *)in_stack_ffffffffffffff78), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_clipp::parser::missing_event_*,_std::vector<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>_>
    ::operator*(&local_40);
    ppVar4 = parser::missing_event::param((missing_event *)&stack0xffffffffffffffa8);
    if (ppVar4 != (parameter *)0x0) {
      ppVar4 = parser::missing_event::param((missing_event *)&stack0xffffffffffffffa8);
      in_stack_ffffffffffffff80 = (arg_mapping *)&ppVar4->super_action_provider<clipp::parameter>;
      parser::missing_event::after_index((missing_event *)&stack0xffffffffffffffa8);
      action_provider<clipp::parameter>::notify_missing
                (in_stack_ffffffffffffffa0,(arg_index)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    __gnu_cxx::
    __normal_iterator<const_clipp::parser::missing_event_*,_std::vector<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>_>
    ::operator++(&local_40);
  }
  return;
}

Assistant:

void execute_actions(const parsing_result& res)
{
    for(const auto& m : res) {
        if(m.param()) {
            const auto& param = *(m.param());

            if(m.repeat() > 0) param.notify_repeated(m.index());
            if(m.blocked())    param.notify_blocked(m.index());
            if(m.conflict())   param.notify_conflict(m.index());
            //main action
            if(!m.any_error()) param.execute_actions(m.arg());
        }
    }

    for(auto m : res.missing()) {
        if(m.param()) m.param()->notify_missing(m.after_index());
    }
}